

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint addChunk_bKGD(ucvector *out,LodePNGInfo *info)

{
  uint uVar1;
  long in_RSI;
  ucvector bKGD;
  uint error;
  ucvector *in_stack_ffffffffffffffc8;
  uchar *in_stack_ffffffffffffffd0;
  uchar *in_stack_ffffffffffffffd8;
  char *in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 uVar2;
  
  uVar2 = 0;
  ucvector_init((ucvector *)&stack0xffffffffffffffd0);
  if ((*(int *)(in_RSI + 0x10) == 0) || (*(int *)(in_RSI + 0x10) == 4)) {
    ucvector_push_back(in_stack_ffffffffffffffc8,'\0');
    ucvector_push_back(in_stack_ffffffffffffffc8,'\0');
  }
  else if ((*(int *)(in_RSI + 0x10) == 2) || (*(int *)(in_RSI + 0x10) == 6)) {
    ucvector_push_back(in_stack_ffffffffffffffc8,'\0');
    ucvector_push_back(in_stack_ffffffffffffffc8,'\0');
    ucvector_push_back(in_stack_ffffffffffffffc8,'\0');
    ucvector_push_back(in_stack_ffffffffffffffc8,'\0');
    ucvector_push_back(in_stack_ffffffffffffffc8,'\0');
    ucvector_push_back(in_stack_ffffffffffffffc8,'\0');
  }
  else if (*(int *)(in_RSI + 0x10) == 3) {
    ucvector_push_back(in_stack_ffffffffffffffc8,'\0');
  }
  uVar1 = addChunk((ucvector *)CONCAT44(uVar2,in_stack_ffffffffffffffe8),in_stack_ffffffffffffffe0,
                   in_stack_ffffffffffffffd8,(size_t)in_stack_ffffffffffffffd0);
  ucvector_cleanup((void *)0x2b6eb1);
  return uVar1;
}

Assistant:

static unsigned addChunk_bKGD(ucvector* out, const LodePNGInfo* info)
{
  unsigned error = 0;
  ucvector bKGD;
  ucvector_init(&bKGD);
  if(info->color.colortype == LCT_GREY || info->color.colortype == LCT_GREY_ALPHA)
  {
    ucvector_push_back(&bKGD, (unsigned char)(info->background_r / 256));
    ucvector_push_back(&bKGD, (unsigned char)(info->background_r % 256));
  }
  else if(info->color.colortype == LCT_RGB || info->color.colortype == LCT_RGBA)
  {
    ucvector_push_back(&bKGD, (unsigned char)(info->background_r / 256));
    ucvector_push_back(&bKGD, (unsigned char)(info->background_r % 256));
    ucvector_push_back(&bKGD, (unsigned char)(info->background_g / 256));
    ucvector_push_back(&bKGD, (unsigned char)(info->background_g % 256));
    ucvector_push_back(&bKGD, (unsigned char)(info->background_b / 256));
    ucvector_push_back(&bKGD, (unsigned char)(info->background_b % 256));
  }
  else if(info->color.colortype == LCT_PALETTE)
  {
    ucvector_push_back(&bKGD, (unsigned char)(info->background_r % 256)); /*palette index*/
  }

  error = addChunk(out, "bKGD", bKGD.data, bKGD.size);
  ucvector_cleanup(&bKGD);

  return error;
}